

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

string * __thiscall Image::toString_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  ostream *poVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->height != 0) {
    uVar4 = 0;
    do {
      if (this->width != 0) {
        uVar2 = 0;
        do {
          if (this->colors != 0) {
            uVar5 = 0;
            do {
              *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
              poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              pcVar3 = ",";
              if (uVar5 == this->colors - 1) {
                pcVar3 = "|";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,1);
              uVar5 = uVar5 + 1;
            } while (uVar5 < this->colors);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->width);
      }
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->height);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Image::toString() {
  std::stringstream ss;
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        ss << std::setw(3) << (unsigned int) pixels[(y * width + x)].colors[c]
           << (c == colors - 1 ? "|" : ",");
      }
    }
    ss << std::endl;
  }
  return ss.str();
}